

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.cpp
# Opt level: O1

void TestSignalInClass(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  bool actual;
  string dataB;
  TestA ta;
  TestB tb;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  TestA local_100;
  TestB local_b0;
  connection local_60;
  connection local_48;
  
  TestRunner::StartTest("TestSignalInClass");
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"DFBZ12Paql","");
  lsignal::slot::slot(&local_100.super_slot);
  local_100.super_slot._vptr_slot = (_func_int **)&PTR__TestA_0011a840;
  local_100.sigA._data.
  super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_100.sigA._data.
  super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
  (local_100.sigA._data.
   super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_use_count = 1;
  (local_100.sigA._data.
   super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_weak_count = 1;
  (local_100.sigA._data.
   super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0011ab60
  ;
  local_100.sigA._data.
  super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)
         (local_100.sigA._data.
          super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi + 1);
  local_100.sigA._data.
  super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_100.sigA._data.
  super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[4]._M_use_count = 0;
  local_100.sigA._data.
  super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[4]._M_weak_count = 0;
  local_100.sigA._data.
  super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_100.sigA._data.
  super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._M_use_count = 0;
  local_100.sigA._data.
  super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._M_weak_count = 0;
  local_100.sigA._data.
  super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_100.sigA._data.
  super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[2]._M_use_count = 0;
  local_100.sigA._data.
  super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[2]._M_weak_count = 0;
  local_100.sigA._data.
  super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_100.sigA._data.
  super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[3]._M_use_count = 0;
  local_100.sigA._data.
  super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[3]._M_weak_count = 0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   &local_100.sigA._data.
    super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[4]._M_use_count =
       local_100.sigA._data.
       super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi + 4;
  local_100.sigA._data.
  super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[4]._vptr__Sp_counted_base =
       (_func_int **)
       (local_100.sigA._data.
        super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi + 4);
  local_100.sigA._data.
  super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  paVar1 = &local_100.dataB.field_2;
  local_100.dataB._M_string_length = 0;
  local_100.dataB.field_2._M_local_buf[0] = '\0';
  local_100.dataB._M_dataplus._M_p = (pointer)paVar1;
  lsignal::slot::slot(&local_b0.super_slot);
  local_b0.super_slot._vptr_slot = (_func_int **)&PTR__TestB_0011a878;
  local_b0.sigB._data.
  super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_b0.sigB._data.
  super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
  (local_b0.sigB._data.
   super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_M_use_count = 1;
  (local_b0.sigB._data.
   super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_M_weak_count = 1;
  (local_b0.sigB._data.
   super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_0011a8b0;
  local_b0.sigB._data.
  super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)
            (local_b0.sigB._data.
             super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi + 1);
  local_b0.sigB._data.
  super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_b0.sigB._data.
  super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[4]._M_use_count = 0;
  local_b0.sigB._data.
  super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[4]._M_weak_count = 0;
  local_b0.sigB._data.
  super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_b0.sigB._data.
  super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[1]._M_use_count = 0;
  local_b0.sigB._data.
  super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[1]._M_weak_count = 0;
  local_b0.sigB._data.
  super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_b0.sigB._data.
  super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[2]._M_use_count = 0;
  local_b0.sigB._data.
  super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[2]._M_weak_count = 0;
  local_b0.sigB._data.
  super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_b0.sigB._data.
  super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[3]._M_use_count = 0;
  local_b0.sigB._data.
  super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[3]._M_weak_count = 0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   &local_b0.sigB._data.
    super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi[4]._M_use_count =
       local_b0.sigB._data.
       super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi + 4;
  local_b0.sigB._data.
  super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[4]._vptr__Sp_counted_base =
       (_func_int **)
       (local_b0.sigB._data.
        super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi + 4);
  local_b0.sigB._data.
  super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  lsignal::connection::connection(&local_b0.explicitConnectionA);
  lsignal::signal<void(int)>::connect<TestB,TestB>
            (&local_48,&local_100.sigA,&local_b0,0x10f868,(slot *)0x0);
  lsignal::connection::~connection(&local_48);
  lsignal::signal<void(std::__cxx11::string_const&)>::connect<TestA,TestA>
            (&local_60,&local_b0.sigB,&local_100,0x10f970,(slot *)0x0);
  lsignal::connection::~connection(&local_60);
  lsignal::signal<void_(int)>::operator()(&local_100.sigA,0x3ff);
  lsignal::
  signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator()(&local_b0.sigB,&local_120);
  AssertHelper::VerifyValue(true,local_b0.dataA == 0x3ff,"Verify dataA");
  if (local_100.dataB._M_string_length == local_120._M_string_length) {
    if (local_100.dataB._M_string_length == 0) {
      actual = true;
    }
    else {
      iVar2 = bcmp(local_100.dataB._M_dataplus._M_p,local_120._M_dataplus._M_p,
                   local_100.dataB._M_string_length);
      actual = iVar2 == 0;
    }
  }
  else {
    actual = false;
  }
  AssertHelper::VerifyValue(true,actual,"Verify dataB");
  local_b0.super_slot._vptr_slot = (_func_int **)&PTR__TestB_0011a878;
  lsignal::connection::~connection(&local_b0.explicitConnectionA);
  if (local_b0.sigB._data.
      super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.sigB._data.
               super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  lsignal::slot::~slot(&local_b0.super_slot);
  local_100.super_slot._vptr_slot = (_func_int **)&PTR__TestA_0011a840;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.dataB._M_dataplus._M_p != paVar1) {
    operator_delete(local_100.dataB._M_dataplus._M_p,
                    CONCAT71(local_100.dataB.field_2._M_allocated_capacity._1_7_,
                             local_100.dataB.field_2._M_local_buf[0]) + 1);
  }
  if (local_100.sigA._data.
      super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_100.sigA._data.
               super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  lsignal::slot::~slot(&local_100.super_slot);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TestSignalInClass()
{
	TestRunner::StartTest(MethodName);

	int dataA = 1023;
	std::string dataB = "DFBZ12Paql";
	TestA ta;
	TestB tb;

	ta.sigA.connect(&tb, &TestB::ReceiveSigA, &tb);
	tb.sigB.connect(&ta, &TestA::ReceiveSigB, &ta);

	ta.sigA(dataA);
	tb.sigB(dataB);

	AssertHelper::VerifyValue(true, tb.dataA == dataA, "Verify dataA");
	AssertHelper::VerifyValue(true, ta.dataB == dataB, "Verify dataB");
}